

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

int Gia_ManChoiceLevel(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  int Fill;
  int Fill_00;
  int Fill_01;
  int Fill_02;
  int iVar6;
  long lVar7;
  
  Gia_ManCleanLevels(p,p->nObjs);
  Gia_ManIncrementTravId(p);
  pVVar5 = p->vCos;
  if (pVVar5->nSize < 1) {
    iVar6 = 0;
  }
  else {
    lVar7 = 0;
    iVar6 = 0;
    do {
      iVar4 = pVVar5->pArray[lVar7];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_0020d993;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = p->pObjs + iVar4;
      Gia_ManChoiceLevel_rec(p,pGVar1);
      pGVar2 = p->pObjs;
      if ((pGVar1 < pGVar2) || (pGVar2 + p->nObjs <= pGVar1)) goto LAB_0020d974;
      uVar3 = (int)((long)pGVar1 - (long)pGVar2 >> 2) * -0x55555555;
      pVVar5 = p->vLevels;
      Vec_IntFillExtra(pVVar5,uVar3 + 1,Fill);
      if (((int)uVar3 < 0) || (pVVar5->nSize <= (int)uVar3)) goto LAB_0020d955;
      if (iVar6 < pVVar5->pArray[uVar3 & 0x7fffffff]) {
        pGVar2 = p->pObjs;
        if ((pGVar1 < pGVar2) || (pGVar2 + p->nObjs <= pGVar1)) goto LAB_0020d974;
        uVar3 = (int)((long)pGVar1 - (long)pGVar2 >> 2) * -0x55555555;
        pVVar5 = p->vLevels;
        Vec_IntFillExtra(pVVar5,uVar3 + 1,Fill_00);
        if (((int)uVar3 < 0) || (pVVar5->nSize <= (int)uVar3)) goto LAB_0020d955;
        iVar6 = pVVar5->pArray[uVar3 & 0x7fffffff];
      }
      lVar7 = lVar7 + 1;
      pVVar5 = p->vCos;
    } while (lVar7 < pVVar5->nSize);
  }
  pVVar5 = p->vCis;
  if (0 < pVVar5->nSize) {
    lVar7 = 0;
    do {
      iVar4 = pVVar5->pArray[lVar7];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) {
LAB_0020d993:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = p->pObjs + iVar4;
      Gia_ManChoiceLevel_rec(p,pGVar1);
      pGVar2 = p->pObjs;
      if ((pGVar1 < pGVar2) || (pGVar2 + p->nObjs <= pGVar1)) goto LAB_0020d974;
      uVar3 = (int)((long)pGVar1 - (long)pGVar2 >> 2) * -0x55555555;
      pVVar5 = p->vLevels;
      Vec_IntFillExtra(pVVar5,uVar3 + 1,Fill_01);
      if (((int)uVar3 < 0) || (pVVar5->nSize <= (int)uVar3)) goto LAB_0020d955;
      if (iVar6 < pVVar5->pArray[uVar3 & 0x7fffffff]) {
        pGVar2 = p->pObjs;
        if ((pGVar1 < pGVar2) || (pGVar2 + p->nObjs <= pGVar1)) {
LAB_0020d974:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar3 = (int)((long)pGVar1 - (long)pGVar2 >> 2) * -0x55555555;
        pVVar5 = p->vLevels;
        Vec_IntFillExtra(pVVar5,uVar3 + 1,Fill_02);
        if (((int)uVar3 < 0) || (pVVar5->nSize <= (int)uVar3)) goto LAB_0020d955;
        iVar6 = pVVar5->pArray[uVar3 & 0x7fffffff];
      }
      lVar7 = lVar7 + 1;
      pVVar5 = p->vCis;
    } while (lVar7 < pVVar5->nSize);
  }
  iVar4 = p->nObjs;
  if (0 < iVar4) {
    lVar7 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return iVar6;
      }
      uVar3 = *(uint *)(p->pObjs + lVar7);
      if (-1 < (int)uVar3 && (~uVar3 & 0x1fffffff) != 0) {
        pVVar5 = p->vLevels;
        Vec_IntFillExtra(pVVar5,(int)lVar7 + 1,
                         (int)CONCAT71((int7)((ulong)(lVar7 * 3) >> 8),-1 < (int)uVar3));
        if (pVVar5->nSize <= lVar7) {
LAB_0020d955:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (pVVar5->pArray[lVar7] < 1) {
          __assert_fail("Gia_ObjLevel(p, pObj) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                        ,0x2f1,"int Gia_ManChoiceLevel(Gia_Man_t *)");
        }
        iVar4 = p->nObjs;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar4);
  }
  return iVar6;
}

Assistant:

int Gia_ManChoiceLevel( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, LevelMax = 0;
//    assert( Gia_ManRegNum(p) == 0 );
    Gia_ManCleanLevels( p, Gia_ManObjNum(p) );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachCo( p, pObj, i )
    {
        Gia_ManChoiceLevel_rec( p, pObj );
        if ( LevelMax < Gia_ObjLevel(p, pObj) )
            LevelMax = Gia_ObjLevel(p, pObj);
    }
    // account for dangling boxes
    Gia_ManForEachCi( p, pObj, i )
    {
        Gia_ManChoiceLevel_rec( p, pObj );
        if ( LevelMax < Gia_ObjLevel(p, pObj) )
            LevelMax = Gia_ObjLevel(p, pObj);
//        Abc_Print( 1, "%d ", Gia_ObjLevel(p, pObj) );
    }
//    Abc_Print( 1, "\n" );
    Gia_ManForEachAnd( p, pObj, i )
        assert( Gia_ObjLevel(p, pObj) > 0 );
//    printf( "Max level %d\n", LevelMax );
    return LevelMax;
}